

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareWinAddMissing(Odc_Man_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Odc_Man_t *p_local;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vLeaves), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,local_24);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  Vec_PtrClear(p->vBranches);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vRoots);
    if (iVar1 <= local_24) {
      return 1;
    }
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,local_24);
    iVar1 = Abc_NtkDontCareWinAddMissing_rec(p,pAVar2);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int Abc_NtkDontCareWinAddMissing( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // set the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // explore from the roots
    Vec_PtrClear( p->vBranches );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        if ( !Abc_NtkDontCareWinAddMissing_rec( p, pObj ) )
            return 0;
    return 1;
}